

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementTetraCorot_4_P::UpdateRotation(ChElementTetraCorot_4_P *this)

{
  UpdateRotation((ChElementTetraCorot_4_P *)&this[-1].Volume);
  return;
}

Assistant:

void ChElementTetraCorot_4_P::UpdateRotation() {
    // P = [ p_0  p_1  p_2  p_3 ]
    //     [ 1    1    1    1   ]
    ChMatrixNM<double, 4, 4> P;
    P.block(0, 0, 3, 1) = nodes[0]->GetPos().eigen();
    P.block(0, 1, 3, 1) = nodes[1]->GetPos().eigen();
    P.block(0, 2, 3, 1) = nodes[2]->GetPos().eigen();
    P.block(0, 3, 3, 1) = nodes[3]->GetPos().eigen();
    P.row(3).setConstant(1.0);

    ChMatrix33<double> F;
    // F=P*mM (only upper-left 3x3 block!)
    double sum;
    for (int colres = 0; colres < 3; ++colres)
        for (int row = 0; row < 3; ++row) {
            sum = 0;
            for (int col = 0; col < 4; ++col)
                sum += (P(row, col)) * (mM(col, colres));
            F(row, colres) = sum;
        }
    ChMatrix33<> S;
    double det = ChPolarDecomposition<>::Compute(F, this->A, S, 1E-6);
    if (det < 0)
        this->A *= -1.0;
}